

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

void mbedtls_strerror(int ret,char *buf,size_t buflen)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  char *__format;
  char *__format_00;
  short sVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  char *__format_01;
  char *__format_02;
  size_t local_48;
  
  if (buflen == 0) {
    return;
  }
  memset(buf,0,buflen);
  uVar7 = -ret;
  if (0 < ret) {
    uVar7 = ret;
  }
  uVar5 = uVar7 & 0xff80;
  if ((uVar7 & 0xff80) == 0) goto LAB_0011b6dc;
  if (uVar5 == 0x1080) {
    pcVar3 = "PEM - No PEM header or footer found";
    goto LAB_0011b6a4;
  }
  sVar4 = (short)uVar5;
  if (uVar5 == 0x1100) {
    snprintf(buf,buflen,"PEM - PEM string is not as expected");
LAB_00119f26:
    if (sVar4 == 0x4400) goto switchD_0011b618_caseD_0;
    if (uVar5 == 0x1e00) goto LAB_0011b355;
    if (uVar5 == 0x1e80) goto LAB_0011b361;
    if (uVar5 == 0x1f00) goto LAB_0011b28d;
    if (uVar5 == 0x1f80) goto LAB_0011af39;
    if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
    if (uVar5 == 0x2e80) goto LAB_0011b36d;
    if (uVar5 == 0x2f00) goto LAB_0011b379;
    if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
    if (uVar5 == 0x3880) goto switchD_0011a112_caseD_35;
    if (uVar5 == 0x3900) goto switchD_0011a112_caseD_36;
    if (uVar5 == 0x3980) goto switchD_00119868_caseD_2;
    if (uVar5 == 0x3a00) goto switchD_00119868_caseD_3;
    if (uVar5 == 0x3a80) goto switchD_00119868_caseD_4;
    if (uVar5 == 0x3b00) goto switchD_0011a112_caseD_3a;
    if (uVar5 == 0x3b80) goto switchD_0011a112_caseD_3b;
    if (uVar5 == 0x3c00) goto switchD_0011a112_caseD_3c;
    if (uVar5 == 0x3c80) {
switchD_00119868_caseD_8:
      pcVar3 = "PK - Key algorithm is unsupported (only RSA and EC are supported)";
      goto LAB_0011b6a4;
    }
    if (uVar5 == 0x3d00) goto switchD_0011a112_caseD_3e;
    if (uVar5 == 0x3d80) goto switchD_0011a112_caseD_3f;
    if (uVar5 == 0x3e00) goto switchD_0011a112_caseD_40;
    if (uVar5 == 16000) goto switchD_0011a112_caseD_41;
    if (uVar5 == 0x3f00) goto switchD_0011a112_caseD_42;
    if (uVar5 == 0x3f80) goto switchD_00119868_caseD_e;
    if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
    if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
    if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
    if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
    if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
    if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
    if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
    if (uVar5 == 0x1480) goto LAB_0011a08b;
    goto LAB_0011b636;
  }
  if (uVar5 == 0x1180) {
    pcVar3 = "PEM - Failed to allocate memory";
    goto switchD_00119868_caseD_27;
  }
  if (uVar5 != 0x1200) {
    if (uVar5 == 0x1280) {
      pcVar3 = "PEM - Unsupported key encryption algorithm";
      goto LAB_0011b566;
    }
    if (uVar5 == 0x1300) {
      pcVar6 = "PEM - Private key password can\'t be empty";
      goto LAB_0011b5a8;
    }
    if (uVar5 == 0x1380) {
      pcVar3 = "PEM - Given private key password does not allow for correct decryption";
      goto LAB_0011b6a4;
    }
    if (uVar5 == 0x1400) {
      pcVar6 = "PEM - Unavailable feature, e.g. hashing/encryption combination";
LAB_00119f12:
      snprintf(buf,buflen,pcVar6);
      goto LAB_00119f26;
    }
    if (uVar5 != 0x1480) {
      if (uVar5 == 0x1e00) goto LAB_0011b355;
      if (uVar5 == 0x1e80) goto LAB_0011b361;
      if (uVar5 == 0x1f00) goto LAB_0011b28d;
      if (uVar5 == 0x1f80) goto LAB_0011af39;
      if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
      if (uVar5 != 0x3080) {
        if (uVar5 == 0x3100) {
          pcVar3 = "DHM - Reading of the DHM parameters failed";
          goto LAB_0011b6a4;
        }
        if (uVar5 == 0x3180) {
          pcVar3 = "DHM - Making of the DHM parameters failed";
          goto LAB_0011b6a4;
        }
        if (uVar5 == 0x3200) {
          pcVar3 = "DHM - Reading of the public values failed";
          goto LAB_0011b6a4;
        }
        if (uVar5 == 0x3280) {
          pcVar3 = "DHM - Making of the public value failed";
          goto LAB_0011b6a4;
        }
        if (uVar5 == 0x3300) {
          pcVar3 = "DHM - Calculation of the DHM secret failed";
          goto LAB_0011b6a4;
        }
        if (uVar5 == 0x3380) {
          pcVar3 = "DHM - The ASN.1 data is not formatted correctly";
          goto LAB_0011b6a4;
        }
        if (uVar5 == 0x3400) {
          pcVar3 = "DHM - Allocation of memory failed";
          goto LAB_0011b6a4;
        }
        if (uVar5 == 0x3480) {
          pcVar3 = "DHM - Read or write of file failed";
          goto LAB_0011b6a4;
        }
        if (uVar5 == 0x3500) {
          pcVar3 = "DHM - DHM hardware accelerator failed";
          goto LAB_0011b6a4;
        }
        pcVar3 = "ECP - The buffer contains a valid signature followed by more data";
        __format_00 = "ECP - Generation of random value, such as ephemeral key, failed";
        __format = "ECP - Memory allocation failed";
        __format_01 = "ECP - The signature is not valid";
        __format_02 = 
        "ECP - The requested feature is not available, for example, the requested curve is not supported"
        ;
        pcVar6 = "ECP - The buffer is too small to write to";
        if (uVar5 == 0x3580) {
          snprintf(buf,buflen,"DHM - Setting the modulus and generator failed");
          goto LAB_0011b482;
        }
        if (uVar5 == 0x3880) goto switchD_0011a112_caseD_35;
        if (uVar5 == 0x3900) goto switchD_0011a112_caseD_36;
        if (uVar5 == 0x3980) goto switchD_00119868_caseD_2;
        if (uVar5 == 0x3a00) goto switchD_00119868_caseD_3;
        if (uVar5 == 0x3a80) goto switchD_00119868_caseD_4;
        if (uVar5 == 0x3b00) goto switchD_0011a112_caseD_3a;
        if (uVar5 == 0x3b80) goto switchD_0011a112_caseD_3b;
        if (uVar5 == 0x3c00) goto switchD_0011a112_caseD_3c;
        if (uVar5 == 0x3c80) goto switchD_00119868_caseD_8;
        if (uVar5 == 0x3d00) goto switchD_0011a112_caseD_3e;
        if (uVar5 == 0x3d80) goto switchD_0011a112_caseD_3f;
        if (uVar5 == 0x3e00) goto switchD_0011a112_caseD_40;
        if (uVar5 == 16000) goto switchD_0011a112_caseD_41;
        if (uVar5 == 0x3f00) goto switchD_0011a112_caseD_42;
        if (uVar5 == 0x3f80) {
switchD_00119868_caseD_e:
          pcVar3 = "PK - Memory allocation failed";
          goto LAB_0011a0d3;
        }
        if (uVar5 == 0x4b00) {
switchD_00119868_caseD_25:
          pcVar3 = "ECP - Operation in progress, call again with the same parameters to continue";
          goto switchD_0011a112_caseD_49;
        }
        if (uVar5 == 0x4b80) {
switchD_00119868_caseD_26:
          pcVar3 = "ECP - The ECP hardware accelerator failed";
          goto switchD_00119868_caseD_27;
        }
        if (uVar5 == 0x4c00) goto switchD_00119868_caseD_27;
        if (uVar5 == 0x4c80) {
          snprintf(buf,buflen,"ECP - Invalid private or public key");
LAB_0011983f:
          pcVar3 = "ECP - The buffer contains a valid signature followed by more data";
          switch(uVar5 - 0x3880 >> 7) {
          case 0:
            goto switchD_0011a112_caseD_35;
          case 1:
            goto switchD_0011a112_caseD_36;
          case 2:
            goto switchD_00119868_caseD_2;
          case 3:
            goto switchD_00119868_caseD_3;
          case 4:
            goto switchD_00119868_caseD_4;
          case 5:
            goto switchD_0011a112_caseD_3a;
          case 6:
            goto switchD_0011a112_caseD_3b;
          case 7:
            goto switchD_0011a112_caseD_3c;
          case 8:
            goto switchD_00119868_caseD_8;
          case 9:
            goto switchD_0011a112_caseD_3e;
          case 10:
            goto switchD_0011a112_caseD_3f;
          case 0xb:
            goto switchD_0011a112_caseD_40;
          case 0xc:
            goto switchD_0011a112_caseD_41;
          case 0xd:
            goto switchD_0011a112_caseD_42;
          case 0xe:
            goto switchD_00119868_caseD_e;
          case 0x25:
            goto switchD_00119868_caseD_25;
          case 0x26:
            goto switchD_00119868_caseD_26;
          case 0x27:
            goto switchD_00119868_caseD_27;
          }
          goto switchD_00119868_caseD_f;
        }
        if (uVar5 == 0x4d00) goto LAB_0011b46e;
        if (uVar5 == 0x4d80) goto LAB_0011a600;
        if (uVar5 == 0x4e00) goto LAB_0011a4a1;
        if (uVar5 == 0x4e80) goto LAB_0011a337;
        if (uVar5 == 0x4f00) goto LAB_00119f12;
        if (uVar5 == 0x4f80) {
          snprintf(buf,buflen,"ECP - Bad input parameters to function");
          goto LAB_0011983f;
        }
        if (uVar5 == 0x5080) {
          pcVar3 = "MD - The selected feature is not available";
          goto switchD_0011a112_caseD_49;
        }
        if (uVar5 == 0x5100) {
          pcVar3 = "MD - Bad input parameters to function";
          goto LAB_0011b566;
        }
        if (uVar5 != 0x5180) {
          if (uVar5 == 0x5200) {
            pcVar6 = "MD - Opening or reading of file failed";
            goto LAB_0011b5a8;
          }
          if (uVar5 == 0x5280) {
            snprintf(buf,buflen,"MD - MD hardware accelerator failed");
            goto switchD_0011b618_default;
          }
          if (uVar5 == 0x6080) {
            pcVar3 = "CIPHER - The selected feature is not available";
            goto LAB_0011b6a4;
          }
          if (uVar5 == 0x6100) {
            pcVar3 = "CIPHER - Bad input parameters";
            goto LAB_0011a0d3;
          }
          if (uVar5 == 0x6400) {
            pcVar3 = "CIPHER - Cipher hardware accelerator failed";
            goto LAB_0011b6a4;
          }
          if (uVar5 == 0x6200) {
            pcVar3 = "CIPHER - Input data contains invalid padding and is rejected";
            goto LAB_0011b566;
          }
          if (uVar5 == 0x6280) {
            pcVar3 = "CIPHER - Decryption of block requires a full block";
            goto LAB_0011b6a4;
          }
          if (uVar5 == 0x6300) {
            pcVar3 = "CIPHER - Authentication failed (for AEAD modes)";
            goto LAB_0011b6a4;
          }
          if (uVar5 == 0x6380) {
            pcVar3 = "CIPHER - The context is invalid. For example, because it was freed";
            goto LAB_0011b6a4;
          }
          if (uVar5 == 0x6180) {
            pcVar3 = "CIPHER - Failed to allocate memory";
            goto LAB_0011b6a4;
          }
          goto LAB_0011b2b5;
        }
        pcVar6 = "MD - Failed to allocate memory";
        goto LAB_0011b5a8;
      }
      pcVar3 = "DHM - Bad input parameters";
      goto LAB_0011b6a4;
    }
LAB_0011a08b:
    snprintf(buf,buflen,"PEM - Bad input parameters to function");
    uVar1 = uVar5 - 0x3c80 >> 7;
    if (uVar1 < 7) {
      (*(code *)(&DAT_00133254 + *(int *)(&DAT_00133254 + (ulong)uVar1 * 4)))();
      return;
    }
    goto switchD_0011b618_default;
  }
  pcVar3 = "PEM - RSA IV is not in hex-format";
LAB_0011a0d3:
  snprintf(buf,buflen,pcVar3);
  pcVar6 = "RSA - The private key operation failed";
  pcVar3 = "RSA - The public key operation failed";
  switch(uVar5 - 0x1e00 >> 7) {
  case 0:
    snprintf(buf,buflen,"PKCS12 - Given private key password does not allow for correct decryption")
    ;
    if (sVar4 == 0x2e00) goto switchD_0011a112_caseD_20;
    if (uVar5 == 0x2e80) goto LAB_0011b36d;
    if (uVar5 == 0x2f00) goto LAB_0011b379;
    if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
    if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
    goto LAB_0011b482;
  case 1:
    snprintf(buf,buflen,"PKCS12 - PBE ASN.1 data not as expected");
    if (sVar4 != 0x4580) {
      if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
      if (uVar5 == 0x2e80) goto LAB_0011b36d;
      if (uVar5 == 0x2f00) goto LAB_0011b379;
      if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
      if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
      if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
      if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
      if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
      if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
      if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
      if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
      if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
      if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
      if (uVar5 != 0x4500) {
        if (uVar5 != 0x1e00) goto switchD_0011b618_default;
        goto LAB_0011b355;
      }
      break;
    }
    goto switchD_0011b618_caseD_3;
  case 2:
    snprintf(buf,buflen,"PKCS12 - Feature not available, e.g. unsupported encryption scheme");
    if (sVar4 != 0x1e00) {
      if (uVar5 == 0x4580) goto switchD_0011b618_caseD_3;
      if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
      if (uVar5 == 0x2e80) goto LAB_0011b36d;
      if (uVar5 == 0x2f00) goto LAB_0011b379;
      if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
      if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
      if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
      if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
      if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
      if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
      if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
      if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
      if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
      if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
      if (uVar5 != 0x4500) {
        if (uVar5 != 0x1e80) goto switchD_0011b618_default;
        goto LAB_0011b361;
      }
      break;
    }
    goto LAB_0011b355;
  case 3:
    snprintf(buf,buflen,"PKCS12 - Bad input parameters to function");
    if (sVar4 == 0x1e00) goto LAB_0011b355;
    if (uVar5 == 0x1e80) goto LAB_0011b361;
    if (uVar5 == 0x4580) goto switchD_0011b618_caseD_3;
    if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
    if (uVar5 == 0x2e80) goto LAB_0011b36d;
    if (uVar5 == 0x2f00) goto LAB_0011b379;
    if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
    if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
    if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
    if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
    if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
    if (uVar5 == 0x4280) goto LAB_0011b566;
    if (uVar5 == 0x4300) goto LAB_0011b5a8;
    if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
    if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
    if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
    if (uVar5 != 0x4500) {
      if (uVar5 == 0x1f00) goto LAB_0011b28d;
      goto switchD_0011b618_default;
    }
    break;
  default:
    goto switchD_0011a112_caseD_4;
  case 0x20:
    goto switchD_0011a112_caseD_20;
  case 0x21:
    snprintf(buf,buflen,"PKCS5 - Requested encryption or digest alg not available");
    if (sVar4 == 0x4580) goto switchD_0011b618_caseD_3;
    if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
    if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
    if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
    if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
    if (uVar5 != 0x4280) {
      if (uVar5 == 0x4300) goto LAB_0011b5a8;
      if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
      if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
      if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
      if (uVar5 != 0x4500) {
        if (uVar5 != 0x2e00) goto switchD_0011b618_default;
        goto switchD_0011a112_caseD_20;
      }
      break;
    }
    goto LAB_0011b566;
  case 0x22:
    snprintf(buf,buflen,"PKCS5 - Unexpected ASN.1 data");
    if (sVar4 == 0x2e00) goto switchD_0011a112_caseD_20;
    if (uVar5 == 0x4580) goto switchD_0011b618_caseD_3;
    if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
    if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
    if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
    if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
    if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
    if (uVar5 != 0x4300) {
      if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
      if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
      if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
      if (uVar5 != 0x4500) {
        if (uVar5 != 0x2e80) goto switchD_0011b618_default;
        goto LAB_0011b36d;
      }
      break;
    }
    goto switchD_0011b59a_caseD_0;
  case 0x23:
    goto switchD_0011a112_caseD_23;
  case 0x35:
    goto switchD_0011a112_caseD_35;
  case 0x36:
    goto switchD_0011a112_caseD_36;
  case 0x37:
switchD_0011a112_caseD_37:
    snprintf(buf,buflen,"PK - Unavailable feature, e.g. RSA disabled for RSA key");
    if (sVar4 == 0x1e00) goto LAB_0011b355;
    if (uVar5 == 0x1e80) goto LAB_0011b361;
    if (uVar5 == 0x1f00) goto LAB_0011b28d;
    if (uVar5 == 0x1f80) goto LAB_0011af39;
    if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
    if (uVar5 == 0x2e80) goto LAB_0011b36d;
    if (uVar5 == 0x2f00) goto LAB_0011b379;
    if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
    if (uVar5 == 0x3880) goto switchD_0011a112_caseD_35;
    if (uVar5 == 0x4580) goto switchD_0011b618_caseD_3;
    if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
    if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
    if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
    if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
    if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
    if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
    if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
    if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
    if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
    if (uVar5 != 0x4500) {
      if (uVar5 != 0x3900) goto switchD_0011b618_default;
      goto switchD_0011a112_caseD_36;
    }
    break;
  case 0x38:
switchD_0011a112_caseD_38:
    snprintf(buf,buflen,"PK - Elliptic curve is unsupported (only NIST curves are supported)");
    if (sVar4 == 0x1e00) goto LAB_0011b355;
    if (uVar5 == 0x1e80) goto LAB_0011b361;
    if (uVar5 == 0x1f00) goto LAB_0011b28d;
    if (uVar5 == 0x1f80) goto LAB_0011af39;
    if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
    if (uVar5 == 0x2e80) goto LAB_0011b36d;
    if (uVar5 == 0x2f00) goto LAB_0011b379;
    if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
    if (uVar5 == 0x3880) goto switchD_0011a112_caseD_35;
    if (uVar5 == 0x3900) goto switchD_0011a112_caseD_36;
    if (uVar5 == 0x4580) goto switchD_0011b618_caseD_3;
    if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
    if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
    if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
    if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
    if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
    if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
    if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
    if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
    if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
    if (uVar5 != 0x4500) {
      if (uVar5 == 0x3980) goto switchD_00119868_caseD_2;
      goto switchD_0011b618_default;
    }
    break;
  case 0x39:
switchD_0011a112_caseD_39:
    snprintf(buf,buflen,"PK - The algorithm tag or value is invalid");
    if (sVar4 == 0x1e00) goto LAB_0011b355;
    if (uVar5 == 0x1e80) goto LAB_0011b361;
    if (uVar5 == 0x1f00) goto LAB_0011b28d;
    if (uVar5 == 0x1f80) goto LAB_0011af39;
    if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
    if (uVar5 == 0x2e80) goto LAB_0011b36d;
    if (uVar5 == 0x2f00) goto LAB_0011b379;
    if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
    if (uVar5 == 0x3880) goto switchD_0011a112_caseD_35;
    if (uVar5 == 0x3900) goto switchD_0011a112_caseD_36;
    if (uVar5 == 0x3980) goto switchD_00119868_caseD_2;
    if (uVar5 == 0x4580) goto switchD_0011b618_caseD_3;
    if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
    if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
    if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
    if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
    if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
    if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
    if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
    if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
    if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
    if (uVar5 != 0x4500) {
      if (uVar5 == 0x3a00) goto switchD_00119868_caseD_3;
      goto switchD_0011b618_default;
    }
    break;
  case 0x3a:
    goto switchD_0011a112_caseD_3a;
  case 0x3b:
switchD_0011a112_caseD_3b:
    snprintf(buf,buflen,"PK - Given private key password does not allow for correct decryption");
    goto switchD_0011a1a7_default;
  case 0x3c:
switchD_0011a112_caseD_3c:
    snprintf(buf,buflen,"PK - Private key password can\'t be empty");
    switch(uVar5 - 0x3900 >> 7) {
    case 0:
      goto switchD_0011a112_caseD_36;
    case 1:
      goto switchD_0011a112_caseD_37;
    case 2:
      goto switchD_0011a112_caseD_38;
    case 3:
      goto switchD_0011a112_caseD_39;
    case 4:
      goto switchD_0011a112_caseD_3a;
    case 5:
      goto switchD_0011a112_caseD_3b;
    }
    goto switchD_0011a793_default;
  case 0x3d:
switchD_0011a112_caseD_3d:
    snprintf(buf,buflen,"PK - Key algorithm is unsupported (only RSA and EC are supported)");
    if (sVar4 == 0x1e00) goto LAB_0011b355;
    if (uVar5 == 0x1e80) goto LAB_0011b361;
    if (uVar5 == 0x1f00) goto LAB_0011b28d;
    if (uVar5 == 0x1f80) goto LAB_0011af39;
    if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
    if (uVar5 == 0x2e80) goto LAB_0011b36d;
    if (uVar5 == 0x2f00) goto LAB_0011b379;
    if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
    if (uVar5 == 0x3880) goto switchD_0011a112_caseD_35;
    if (uVar5 == 0x3900) goto switchD_0011a112_caseD_36;
    if (uVar5 == 0x3980) goto switchD_00119868_caseD_2;
    if (uVar5 == 0x3a00) goto switchD_00119868_caseD_3;
    if (uVar5 == 0x3a80) goto switchD_00119868_caseD_4;
    if (uVar5 == 0x3b00) goto switchD_0011a112_caseD_3a;
    if (uVar5 == 0x3b80) goto switchD_0011a112_caseD_3b;
    if (uVar5 == 0x4580) goto switchD_0011b618_caseD_3;
    if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
    if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
    if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
    if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
    if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
    if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
    if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
    if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
    if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
    if (uVar5 != 0x4500) {
      if (uVar5 != 0x3c00) goto switchD_0011b618_default;
      goto switchD_0011a112_caseD_3c;
    }
    break;
  case 0x3e:
switchD_0011a112_caseD_3e:
    __format = "PK - Invalid key tag or value";
LAB_0011a600:
    snprintf(buf,buflen,__format);
    if (sVar4 == 0x1e00) goto LAB_0011b355;
    if (uVar5 == 0x1e80) goto LAB_0011b361;
    if (uVar5 == 0x1f00) goto LAB_0011b28d;
    if (uVar5 == 0x1f80) goto LAB_0011af39;
    if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
    if (uVar5 == 0x2e80) goto LAB_0011b36d;
    if (uVar5 == 0x2f00) goto LAB_0011b379;
    if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
    if (uVar5 == 0x3880) goto switchD_0011a112_caseD_35;
    if (uVar5 == 0x3900) goto switchD_0011a112_caseD_36;
    if (uVar5 == 0x3980) goto switchD_00119868_caseD_2;
    if (uVar5 == 0x3a00) goto switchD_00119868_caseD_3;
    if (uVar5 == 0x3a80) goto switchD_00119868_caseD_4;
    if (uVar5 == 0x3b00) goto switchD_0011a112_caseD_3a;
    if (uVar5 == 0x3b80) goto switchD_0011a112_caseD_3b;
    if (uVar5 == 0x3c00) goto switchD_0011a112_caseD_3c;
    if (uVar5 == 0x4580) goto switchD_0011b618_caseD_3;
    if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
    if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
    if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
    if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
    if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
    if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
    if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
    if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
    if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
    if (uVar5 != 0x4500) {
      if (uVar5 == 0x3c80) goto switchD_00119868_caseD_8;
      goto switchD_0011b618_default;
    }
    break;
  case 0x3f:
switchD_0011a112_caseD_3f:
    __format_01 = "PK - Unsupported key version";
LAB_0011a4a1:
    snprintf(buf,buflen,__format_01);
    if (sVar4 == 0x1e00) goto LAB_0011b355;
    if (uVar5 == 0x1e80) goto LAB_0011b361;
    if (uVar5 == 0x1f00) goto LAB_0011b28d;
    if (uVar5 == 0x1f80) goto LAB_0011af39;
    if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
    if (uVar5 == 0x2e80) goto LAB_0011b36d;
    if (uVar5 == 0x2f00) goto LAB_0011b379;
    if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
    if (uVar5 == 0x3880) goto switchD_0011a112_caseD_35;
    if (uVar5 == 0x3900) goto switchD_0011a112_caseD_36;
    if (uVar5 == 0x3980) goto switchD_00119868_caseD_2;
    if (uVar5 == 0x3a00) goto switchD_00119868_caseD_3;
    if (uVar5 == 0x3a80) goto switchD_00119868_caseD_4;
    if (uVar5 == 0x3b00) goto switchD_0011a112_caseD_3a;
    if (uVar5 == 0x3b80) goto switchD_0011a112_caseD_3b;
    if (uVar5 == 0x3c00) goto switchD_0011a112_caseD_3c;
    if (uVar5 == 0x3c80) goto switchD_00119868_caseD_8;
    if (uVar5 == 0x4580) goto switchD_0011b618_caseD_3;
    if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
    if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
    if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
    if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
    if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
    if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
    if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
    if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
    if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
    if (uVar5 != 0x4500) {
      if (uVar5 != 0x3d00) goto switchD_0011b618_default;
      goto switchD_0011a112_caseD_3e;
    }
    break;
  case 0x40:
switchD_0011a112_caseD_40:
    __format_02 = "PK - Read/write of file failed";
LAB_0011a337:
    snprintf(buf,buflen,__format_02);
    if (sVar4 == 0x1e00) goto LAB_0011b355;
    if (uVar5 == 0x1e80) goto LAB_0011b361;
    if (uVar5 == 0x1f00) goto LAB_0011b28d;
    if (uVar5 == 0x1f80) goto LAB_0011af39;
    if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
    if (uVar5 == 0x2e80) goto LAB_0011b36d;
    if (uVar5 == 0x2f00) goto LAB_0011b379;
    if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
    if (uVar5 == 0x3880) goto switchD_0011a112_caseD_35;
    if (uVar5 == 0x3900) goto switchD_0011a112_caseD_36;
    if (uVar5 == 0x3980) goto switchD_00119868_caseD_2;
    if (uVar5 == 0x3a00) goto switchD_00119868_caseD_3;
    if (uVar5 == 0x3a80) goto switchD_00119868_caseD_4;
    if (uVar5 == 0x3b00) goto switchD_0011a112_caseD_3a;
    if (uVar5 == 0x3b80) goto switchD_0011a112_caseD_3b;
    if (uVar5 == 0x3c00) goto switchD_0011a112_caseD_3c;
    if (uVar5 == 0x3c80) goto switchD_00119868_caseD_8;
    if (uVar5 == 0x3d00) goto switchD_0011a112_caseD_3e;
    if (uVar5 == 0x4580) goto switchD_0011b618_caseD_3;
    if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
    if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
    if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
    if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
    if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
    if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
    if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
    if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
    if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
    if (uVar5 != 0x4500) {
      if (uVar5 != 0x3d80) goto switchD_0011b618_default;
      goto switchD_0011a112_caseD_3f;
    }
    break;
  case 0x41:
switchD_0011a112_caseD_41:
    snprintf(buf,buflen,"PK - Bad input parameters to function");
    switch(uVar5 - 0x3b00 >> 7) {
    case 0:
      goto switchD_0011a112_caseD_3a;
    case 1:
      goto switchD_0011a112_caseD_3b;
    case 2:
      goto switchD_0011a112_caseD_3c;
    case 3:
      goto switchD_0011a112_caseD_3d;
    case 4:
      goto switchD_0011a112_caseD_3e;
    case 5:
      goto switchD_0011a112_caseD_3f;
    case 6:
      goto switchD_0011a112_caseD_40;
    }
    goto switchD_0011a1e3_default;
  case 0x42:
switchD_0011a112_caseD_42:
    snprintf(buf,buflen,"PK - Type mismatch, eg attempt to encrypt with an ECDSA key");
    switch(uVar5 - 0x3b80 >> 7) {
    case 0:
      goto switchD_0011a112_caseD_3b;
    case 1:
      goto switchD_0011a112_caseD_3c;
    case 2:
      goto switchD_0011a112_caseD_3d;
    case 3:
      goto switchD_0011a112_caseD_3e;
    case 4:
      goto switchD_0011a112_caseD_3f;
    case 5:
      goto switchD_0011a112_caseD_40;
    case 6:
      goto switchD_0011a112_caseD_41;
    }
switchD_0011a1a7_default:
    if (sVar4 != 0x1e00) {
      if (uVar5 != 0x1e80) {
        if (uVar5 == 0x1f00) {
LAB_0011b28d:
          pcVar3 = "PKCS12 - Feature not available, e.g. unsupported encryption scheme";
          goto LAB_0011b6a4;
        }
        if (uVar5 == 0x1f80) {
LAB_0011af39:
          pcVar3 = "PKCS12 - Bad input parameters to function";
          goto LAB_0011b6a4;
        }
        if (uVar5 == 0x2e00) {
switchD_0011a112_caseD_20:
          snprintf(buf,buflen,
                   "PKCS5 - Given private key password does not allow for correct decryption");
          switch(uVar5 - 0x4080 >> 7) {
          case 0:
switchD_0011b465_caseD_0:
            __format_00 = "RSA - Bad input parameters to function";
            goto LAB_0011b46e;
          case 1:
            goto switchD_0011b4a4_caseD_0;
          case 2:
            goto switchD_0011b4a4_caseD_1;
          case 3:
            goto switchD_0011b51c_caseD_0;
          case 4:
            goto switchD_0011b51c_caseD_1;
          }
          goto switchD_0011b465_default;
        }
        if (uVar5 == 0x2e80) {
LAB_0011b36d:
          pcVar3 = "PKCS5 - Requested encryption or digest alg not available";
          goto LAB_0011b6a4;
        }
        if (uVar5 == 0x2f00) {
LAB_0011b379:
          pcVar3 = "PKCS5 - Unexpected ASN.1 data";
          goto LAB_0011b6a4;
        }
        if (uVar5 != 0x2f80) {
          if (uVar5 == 0x3880) {
switchD_0011a112_caseD_35:
            snprintf(buf,buflen,"PK - PK hardware accelerator failed");
switchD_00119868_caseD_f:
            if (sVar4 == 0x1e00) goto LAB_0011b355;
            if (uVar5 == 0x1e80) goto LAB_0011b361;
            if (uVar5 == 0x1f00) goto LAB_0011b28d;
            if (uVar5 != 0x4580) {
              if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
              if (uVar5 == 0x2e80) goto LAB_0011b36d;
              if (uVar5 == 0x2f00) goto LAB_0011b379;
              if (uVar5 != 0x2f80) {
                if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
                if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
                if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
                if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
                if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
                if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
                if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
                if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
                if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
                if (uVar5 == 0x4500) break;
                if (uVar5 != 0x1f80) goto switchD_0011b618_default;
                goto LAB_0011af39;
              }
              goto switchD_0011a112_caseD_23;
            }
            goto switchD_0011b618_caseD_3;
          }
          if (uVar5 == 0x3900) {
switchD_0011a112_caseD_36:
            snprintf(buf,buflen,"PK - The buffer contains a valid signature followed by more data");
switchD_0011a793_default:
            if (sVar4 == 0x1e00) goto LAB_0011b355;
            if (uVar5 == 0x1e80) goto LAB_0011b361;
            if (uVar5 == 0x1f00) goto LAB_0011b28d;
            if (uVar5 == 0x1f80) goto LAB_0011af39;
            if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
            if (uVar5 == 0x2e80) goto LAB_0011b36d;
            if (uVar5 == 0x2f00) goto LAB_0011b379;
            if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
            if (uVar5 == 0x4580) goto switchD_0011b618_caseD_3;
            if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
            if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
            if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
            if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
            if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
            if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
            if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
            if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
            if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
            if (uVar5 == 0x4500) break;
            if (uVar5 != 0x3880) goto switchD_0011b618_default;
            goto switchD_0011a112_caseD_35;
          }
          if (uVar5 == 0x3980) {
switchD_00119868_caseD_2:
            pcVar3 = "PK - Unavailable feature, e.g. RSA disabled for RSA key";
            goto LAB_0011b6a4;
          }
          if (uVar5 == 0x3a00) {
switchD_00119868_caseD_3:
            pcVar3 = "PK - Elliptic curve is unsupported (only NIST curves are supported)";
            goto LAB_0011b6a4;
          }
          if (uVar5 == 0x3a80) {
switchD_00119868_caseD_4:
            pcVar3 = "PK - The algorithm tag or value is invalid";
            goto LAB_0011b6a4;
          }
          if (uVar5 == 0x4580) goto switchD_0011b618_caseD_3;
          if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
          if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
          if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
          if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
          if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
          if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
          if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
          if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
          if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
          if (uVar5 == 0x4500) break;
          if (uVar5 == 0x3b00) {
switchD_0011a112_caseD_3a:
            snprintf(buf,buflen,
                     "PK - The pubkey tag or value is invalid (only RSA and EC are supported)");
switchD_0011a1e3_default:
            if (sVar4 == 0x1e00) goto LAB_0011b355;
            if (uVar5 == 0x1e80) goto LAB_0011b361;
            if (uVar5 == 0x1f00) goto LAB_0011b28d;
            if (uVar5 == 0x1f80) goto LAB_0011af39;
            if (uVar5 == 0x2e00) goto switchD_0011a112_caseD_20;
            if (uVar5 == 0x2e80) goto LAB_0011b36d;
            if (uVar5 == 0x2f00) goto LAB_0011b379;
            if (uVar5 == 0x2f80) goto switchD_0011a112_caseD_23;
            if (uVar5 == 0x3880) goto switchD_0011a112_caseD_35;
            if (uVar5 == 0x3900) goto switchD_0011a112_caseD_36;
            if (uVar5 == 0x3980) goto switchD_00119868_caseD_2;
            if (uVar5 == 0x3a00) goto switchD_00119868_caseD_3;
            if (uVar5 == 0x4580) goto switchD_0011b618_caseD_3;
            if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
            if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
            if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
            if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
            if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
            if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
            if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
            if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
            if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
            if (uVar5 == 0x4500) break;
            if (uVar5 == 0x3a80) goto switchD_00119868_caseD_4;
          }
          goto switchD_0011b618_default;
        }
switchD_0011a112_caseD_23:
        snprintf(buf,buflen,"PKCS5 - Bad input parameters to function");
LAB_0011b2b5:
        if (sVar4 == 0x2e00) goto switchD_0011a112_caseD_20;
        if (uVar5 == 0x2e80) goto LAB_0011b36d;
        if (uVar5 == 0x2f00) goto LAB_0011b379;
        if (uVar5 == 0x4080) goto switchD_0011b465_caseD_0;
        if (uVar5 == 0x4100) goto switchD_0011b4a4_caseD_0;
        if (uVar5 == 0x4180) goto switchD_0011b4a4_caseD_1;
        if (uVar5 == 0x4200) goto switchD_0011b51c_caseD_0;
        if (uVar5 == 0x4280) goto switchD_0011b51c_caseD_1;
        if (uVar5 == 0x4300) goto switchD_0011b59a_caseD_0;
        if (uVar5 == 0x4380) goto switchD_0011b5dc_caseD_0;
        if (uVar5 == 0x4400) goto switchD_0011b618_caseD_0;
        if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
        if (uVar5 == 0x4500) break;
        goto joined_r0x0011b34a;
      }
LAB_0011b361:
      pcVar3 = "PKCS12 - PBE ASN.1 data not as expected";
      goto LAB_0011b6a4;
    }
LAB_0011b355:
    __format_00 = "PKCS12 - Given private key password does not allow for correct decryption";
LAB_0011b46e:
    snprintf(buf,buflen,__format_00);
LAB_0011b482:
    switch(uVar5 - 0x4100 >> 7) {
    case 0:
switchD_0011b4a4_caseD_0:
      snprintf(buf,buflen,"RSA - Input data contains invalid padding and is rejected");
      uVar1 = uVar5 - 0x4180 >> 7;
      if (uVar1 < 5) {
        (*(code *)(&DAT_001334d8 + *(int *)(&DAT_001334d8 + (ulong)uVar1 * 4)))();
        return;
      }
      goto LAB_0011b5f6;
    case 1:
switchD_0011b4a4_caseD_1:
      pcVar3 = "RSA - Something failed during generation of a key";
switchD_00119868_caseD_27:
      snprintf(buf,buflen,pcVar3);
      switch(uVar5 - 0x4200 >> 7) {
      case 0:
        goto switchD_0011b51c_caseD_0;
      case 1:
        goto switchD_0011b51c_caseD_1;
      case 2:
        goto switchD_0011b59a_caseD_0;
      case 3:
        goto switchD_0011b5dc_caseD_0;
      case 4:
        goto switchD_0011b618_caseD_0;
      case 5:
        goto switchD_0011b618_caseD_1;
      case 6:
        goto switchD_0011b618_caseD_2;
      case 7:
        goto switchD_0011b618_caseD_3;
      }
      break;
    case 2:
switchD_0011b51c_caseD_0:
      snprintf(buf,buflen,"RSA - Key failed to pass the validity check of the library");
      uVar1 = uVar5 - 0x4280 >> 7;
      if (uVar1 < 5) {
        (*(code *)(&DAT_0013350c + *(int *)(&DAT_0013350c + (ulong)uVar1 * 4)))();
        return;
      }
      goto LAB_0011b664;
    case 3:
switchD_0011b51c_caseD_1:
      pcVar3 = "RSA - The public key operation failed";
switchD_0011a112_caseD_49:
LAB_0011b566:
      snprintf(buf,buflen,pcVar3);
switchD_0011b465_default:
      switch(uVar5 - 0x4300 >> 7) {
      case 0:
        goto switchD_0011b59a_caseD_0;
      case 1:
        goto switchD_0011b5dc_caseD_0;
      case 2:
        goto switchD_0011b618_caseD_0;
      case 3:
        goto switchD_0011b618_caseD_1;
      case 4:
        goto switchD_0011b618_caseD_2;
      case 5:
        goto switchD_0011b618_caseD_3;
      }
      break;
    case 4:
switchD_0011b59a_caseD_0:
switchD_0011a112_caseD_4a:
      pcVar6 = "RSA - The private key operation failed";
LAB_0011b5a8:
      snprintf(buf,buflen,pcVar6);
      switch(uVar5 - 0x4380 >> 7) {
      case 0:
        goto switchD_0011b5dc_caseD_0;
      case 1:
        goto switchD_0011b618_caseD_0;
      case 2:
        goto switchD_0011b618_caseD_1;
      case 3:
        goto switchD_0011b618_caseD_2;
      case 4:
        goto switchD_0011b618_caseD_3;
      }
      break;
    case 5:
switchD_0011b5dc_caseD_0:
      snprintf(buf,buflen,"RSA - The PKCS#1 verification failed");
LAB_0011b5f6:
      switch(uVar5 - 0x4400 >> 7) {
      case 0:
switchD_0011b618_caseD_0:
        snprintf(buf,buflen,"RSA - The output buffer for decryption is not large enough");
LAB_0011b636:
        if (sVar4 == 0x4580) goto switchD_0011b618_caseD_3;
        if (uVar5 == 0x4500) goto switchD_0011b618_caseD_2;
        if (uVar5 == 0x4480) goto switchD_0011b618_caseD_1;
        break;
      case 1:
switchD_0011b618_caseD_1:
        snprintf(buf,buflen,"RSA - The random generator failed to generate non-zeros");
LAB_0011b664:
        if (sVar4 == 0x4580) goto switchD_0011b618_caseD_3;
        if (uVar5 == 0x4500) goto switchD_0011b618_caseD_2;
        break;
      case 2:
        goto switchD_0011b618_caseD_2;
      case 3:
        goto switchD_0011b618_caseD_3;
      }
      break;
    case 6:
      goto switchD_0011b618_caseD_0;
    case 7:
      goto switchD_0011b618_caseD_1;
    case 8:
      goto switchD_0011b618_caseD_2;
    case 9:
      goto switchD_0011b618_caseD_3;
    }
    goto switchD_0011b618_default;
  case 0x45:
    goto switchD_0011b465_caseD_0;
  case 0x46:
    goto switchD_0011b4a4_caseD_0;
  case 0x47:
    goto switchD_0011b4a4_caseD_1;
  case 0x48:
    goto switchD_0011b51c_caseD_0;
  case 0x49:
    goto switchD_0011a112_caseD_49;
  case 0x4a:
    goto switchD_0011a112_caseD_4a;
  case 0x4b:
    goto switchD_0011b5dc_caseD_0;
  case 0x4c:
    goto switchD_0011b618_caseD_0;
  case 0x4d:
    goto switchD_0011b618_caseD_1;
  case 0x4e:
    break;
  }
switchD_0011b618_caseD_2:
  snprintf(buf,buflen,
           "RSA - The implementation does not offer the requested operation, for example, because of security violations or lack of functionality"
          );
switchD_0011a112_caseD_4:
joined_r0x0011b34a:
  if (uVar5 == 0x4580) {
switchD_0011b618_caseD_3:
    pcVar3 = "RSA - RSA hardware accelerator failed";
LAB_0011b6a4:
    snprintf(buf,buflen,pcVar3);
  }
switchD_0011b618_default:
  if (*buf == '\0') {
    snprintf(buf,buflen,"UNKNOWN ERROR CODE (%04X)",(ulong)uVar5);
  }
LAB_0011b6dc:
  uVar5 = uVar7 & 0x7fff007f;
  if ((uVar7 & 0x7fff007f) == 0) {
    return;
  }
  sVar2 = strlen(buf);
  local_48 = buflen;
  if (sVar2 != 0) {
    if (buflen - sVar2 < 5) {
      return;
    }
    snprintf(buf + sVar2,buflen - sVar2," : ");
    buf = buf + sVar2 + 3;
    local_48 = buflen - (sVar2 + 3);
  }
  switch(uVar5) {
  case 2:
    pcVar3 = "BIGNUM - An error occurred while reading from or writing to a file";
    break;
  case 3:
  case 5:
  case 7:
  case 9:
  case 0xb:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x35:
  case 0x37:
  case 0x39:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x52:
LAB_0011b9af:
    switch(uVar5) {
    case 0x28:
      pcVar3 = "XTEA - The data input has an invalid length";
      break;
    case 0x29:
      pcVar3 = "XTEA - XTEA hardware accelerator failed";
      break;
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x34:
    case 0x36:
    case 0x38:
    case 0x3a:
    case 0x3b:
      goto switchD_0011b7b1_caseD_2;
    case 0x2e:
      pcVar3 = "OID - OID is not found";
      break;
    case 0x2f:
      pcVar3 = "MD5 - MD5 hardware accelerator failed";
      break;
    case 0x30:
      pcVar3 = "PADLOCK - Input data should be aligned";
      break;
    case 0x31:
      pcVar3 = "RIPEMD160 - RIPEMD160 hardware accelerator failed";
      break;
    case 0x32:
      pcVar3 = "DES - The data input has an invalid length";
      break;
    case 0x33:
      pcVar3 = "DES - DES hardware accelerator failed";
      break;
    case 0x35:
      pcVar3 = "SHA1 - SHA-1 hardware accelerator failed";
      break;
    case 0x37:
      pcVar3 = "SHA256 - SHA-256 hardware accelerator failed";
      break;
    case 0x39:
      pcVar3 = "SHA512 - SHA-512 hardware accelerator failed";
      break;
    case 0x3c:
      pcVar3 = "ENTROPY - Critical entropy source failure";
      break;
    case 0x3d:
      pcVar3 = "ENTROPY - No strong sources have been added to poll";
      break;
    case 0x3e:
      pcVar3 = "ENTROPY - No more sources can be added";
      break;
    case 0x3f:
      pcVar3 = "ENTROPY - Read/write error in file";
      break;
    case 0x40:
      pcVar3 = "ENTROPY - No sources have been added to poll";
      break;
    default:
      switch(uVar5) {
      case 1:
        pcVar3 = "ERROR - Generic error";
        break;
      case 2:
      case 4:
      case 6:
      case 8:
      case 10:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
        goto switchD_0011b7b1_caseD_2;
      case 3:
        pcVar3 = "HMAC_DRBG - Too many random requested in single call";
        break;
      case 5:
        pcVar3 = "HMAC_DRBG - Input too large (Entropy + additional)";
        break;
      case 7:
        pcVar3 = "HMAC_DRBG - Read/write error in file";
        break;
      case 9:
        pcVar3 = "HMAC_DRBG - The entropy source failed";
        break;
      case 0xb:
        pcVar3 = "OID - output buffer is too small";
        break;
      case 0x12:
        pcVar3 = "GCM - Authenticated decryption failed";
        break;
      case 0x13:
        pcVar3 = "GCM - GCM hardware accelerator failed";
        break;
      case 0x14:
        pcVar3 = "GCM - Bad input parameters to function";
        break;
      default:
        switch(uVar5) {
        case 0x6e:
          pcVar3 = "ERROR - This is a bug in the library";
          break;
        case 0x6f:
        case 0x71:
          goto switchD_0011b7b1_caseD_2;
        case 0x70:
          pcVar3 = "PLATFORM - Hardware accelerator failed";
          break;
        case 0x72:
          pcVar3 = "PLATFORM - The requested feature is not supported by the platform";
          break;
        case 0x73:
          pcVar3 = "SHA1 - SHA-1 input data was malformed";
          break;
        case 0x74:
          pcVar3 = "SHA256 - SHA-256 input data was malformed";
          break;
        case 0x75:
          pcVar3 = "SHA512 - SHA-512 input data was malformed";
          break;
        default:
          if (uVar5 == 0x57) {
            pcVar3 = "POLY1305 - Invalid input parameter(s)";
          }
          else if (uVar5 == 0x59) {
            pcVar3 = 
            "POLY1305 - Feature not available. For example, s part of the API is not implemented";
          }
          else {
            if (uVar5 != 0x5b) goto switchD_0011b7b1_caseD_2;
            pcVar3 = "POLY1305 - Poly1305 hardware accelerator failed";
          }
        }
      }
    }
    break;
  case 4:
    pcVar3 = "BIGNUM - Bad input parameters to function";
    break;
  case 6:
    pcVar3 = "BIGNUM - There is an invalid character in the digit string";
    break;
  case 8:
    pcVar3 = "BIGNUM - The buffer is too small to write to";
    break;
  case 10:
    pcVar3 = "BIGNUM - The input arguments are negative or result in illegal output";
    break;
  case 0xc:
    pcVar3 = "BIGNUM - The input argument for division is zero, which is not allowed";
    break;
  case 0xd:
    pcVar3 = "CCM - Bad input parameters to the function";
    break;
  case 0xe:
    pcVar3 = "BIGNUM - The input arguments are not acceptable";
    break;
  case 0xf:
    pcVar3 = "CCM - Authenticated decryption failed";
    break;
  case 0x10:
    pcVar3 = "BIGNUM - Memory allocation failed";
    break;
  case 0x11:
    pcVar3 = "CCM - CCM hardware accelerator failed";
    break;
  case 0x16:
    pcVar3 = "BLOWFISH - Bad input data";
    break;
  case 0x17:
    pcVar3 = "BLOWFISH - Blowfish hardware accelerator failed";
    break;
  case 0x18:
    pcVar3 = "BLOWFISH - Invalid data input length";
    break;
  case 0x19:
    pcVar3 = "ARC4 - ARC4 hardware accelerator failed";
    break;
  case 0x20:
    pcVar3 = "AES - Invalid key length";
    break;
  case 0x21:
    pcVar3 = "AES - Invalid input data";
    break;
  case 0x22:
    pcVar3 = "AES - Invalid data input length";
    break;
  case 0x23:
    pcVar3 = "AES - Feature not available. For example, an unsupported AES key size";
    break;
  case 0x24:
    pcVar3 = "CAMELLIA - Bad input data";
    break;
  case 0x25:
    pcVar3 = "AES - AES hardware accelerator failed";
    break;
  case 0x26:
    pcVar3 = "CAMELLIA - Invalid data input length";
    break;
  case 0x27:
    pcVar3 = "CAMELLIA - Camellia hardware accelerator failed";
    break;
  case 0x2a:
    pcVar3 = "BASE64 - Output buffer too small";
    break;
  case 0x2c:
    pcVar3 = "BASE64 - Invalid character in input";
    break;
  case 0x34:
    pcVar3 = "CTR_DRBG - The entropy source failed";
    break;
  case 0x36:
    pcVar3 = "CTR_DRBG - The requested random buffer length is too big";
    break;
  case 0x38:
    pcVar3 = "CTR_DRBG - The input (entropy + additional data) is too large";
    break;
  case 0x3a:
    pcVar3 = "CTR_DRBG - Read or write error in file";
    break;
  case 0x51:
    pcVar3 = "CHACHA20 - Invalid input parameter(s)";
    break;
  case 0x53:
    pcVar3 = "CHACHA20 - Feature not available. For example, s part of the API is not implemented";
    break;
  case 0x54:
    pcVar3 = "CHACHAPOLY - The requested operation is not permitted in the current state";
    break;
  case 0x55:
    pcVar3 = "CHACHA20 - Chacha20 hardware accelerator failed";
    break;
  case 0x56:
    pcVar3 = "CHACHAPOLY - Authenticated decryption failed: data was not authentic";
    break;
  default:
    switch(uVar5) {
    case 0x60:
      pcVar3 = "ASN1 - Out of data when parsing an ASN1 data structure";
      break;
    case 0x61:
    case 99:
    case 0x65:
    case 0x67:
    case 0x69:
    case 0x6b:
      goto LAB_0011b9af;
    case 0x62:
      pcVar3 = "ASN1 - ASN1 tag was of an unexpected value";
      break;
    case 100:
      pcVar3 = "ASN1 - Error when trying to determine the length or invalid length";
      break;
    case 0x66:
      pcVar3 = "ASN1 - Actual length differs from expected length";
      break;
    case 0x68:
      pcVar3 = "ASN1 - Data is invalid";
      break;
    case 0x6a:
      pcVar3 = "ASN1 - Memory allocation failed";
      break;
    case 0x6c:
      pcVar3 = "ASN1 - Buffer too small when writing ASN.1 data structure";
      break;
    default:
      if (uVar5 != 0x7a) goto LAB_0011b9af;
      pcVar3 = "CMAC - CMAC hardware accelerator failed";
    }
  }
  snprintf(buf,local_48,pcVar3);
switchD_0011b7b1_caseD_2:
  if (*buf != '\0') {
    return;
  }
  snprintf(buf,local_48,"UNKNOWN ERROR CODE (%04X)",(ulong)uVar5);
  return;
}

Assistant:

void mbedtls_strerror( int ret, char *buf, size_t buflen )
{
    size_t len;
    int use_ret;

    if( buflen == 0 )
        return;

    memset( buf, 0x00, buflen );

    if( ret < 0 )
        ret = -ret;

    if( ret & 0xFF80 )
    {
        use_ret = ret & 0xFF80;

        // High level error codes
        //
        // BEGIN generated code
#if defined(MBEDTLS_CIPHER_C)
        if( use_ret == -(MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "CIPHER - The selected feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Bad input parameters" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_INVALID_PADDING) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Input data contains invalid padding and is rejected" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Decryption of block requires a full block" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_AUTH_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Authentication failed (for AEAD modes)" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_INVALID_CONTEXT) )
            mbedtls_snprintf( buf, buflen, "CIPHER - The context is invalid. For example, because it was freed" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Cipher hardware accelerator failed" );
#endif /* MBEDTLS_CIPHER_C */

#if defined(MBEDTLS_DHM_C)
        if( use_ret == -(MBEDTLS_ERR_DHM_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "DHM - Bad input parameters" );
        if( use_ret == -(MBEDTLS_ERR_DHM_READ_PARAMS_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Reading of the DHM parameters failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_MAKE_PARAMS_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Making of the DHM parameters failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_READ_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Reading of the public values failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_MAKE_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Making of the public value failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_CALC_SECRET_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Calculation of the DHM secret failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "DHM - The ASN.1 data is not formatted correctly" );
        if( use_ret == -(MBEDTLS_ERR_DHM_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Allocation of memory failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "DHM - Read or write of file failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - DHM hardware accelerator failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_SET_GROUP_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Setting the modulus and generator failed" );
#endif /* MBEDTLS_DHM_C */

#if defined(MBEDTLS_ECP_C)
        if( use_ret == -(MBEDTLS_ERR_ECP_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "ECP - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL) )
            mbedtls_snprintf( buf, buflen, "ECP - The buffer is too small to write to" );
        if( use_ret == -(MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "ECP - The requested feature is not available, for example, the requested curve is not supported" );
        if( use_ret == -(MBEDTLS_ERR_ECP_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - The signature is not valid" );
        if( use_ret == -(MBEDTLS_ERR_ECP_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_RANDOM_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - Generation of random value, such as ephemeral key, failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_INVALID_KEY) )
            mbedtls_snprintf( buf, buflen, "ECP - Invalid private or public key" );
        if( use_ret == -(MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "ECP - The buffer contains a valid signature followed by more data" );
        if( use_ret == -(MBEDTLS_ERR_ECP_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - The ECP hardware accelerator failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_IN_PROGRESS) )
            mbedtls_snprintf( buf, buflen, "ECP - Operation in progress, call again with the same parameters to continue" );
#endif /* MBEDTLS_ECP_C */

#if defined(MBEDTLS_MD_C)
        if( use_ret == -(MBEDTLS_ERR_MD_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "MD - The selected feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_MD_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "MD - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_MD_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "MD - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_MD_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "MD - Opening or reading of file failed" );
        if( use_ret == -(MBEDTLS_ERR_MD_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "MD - MD hardware accelerator failed" );
#endif /* MBEDTLS_MD_C */

#if defined(MBEDTLS_PEM_PARSE_C) || defined(MBEDTLS_PEM_WRITE_C)
        if( use_ret == -(MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) )
            mbedtls_snprintf( buf, buflen, "PEM - No PEM header or footer found" );
        if( use_ret == -(MBEDTLS_ERR_PEM_INVALID_DATA) )
            mbedtls_snprintf( buf, buflen, "PEM - PEM string is not as expected" );
        if( use_ret == -(MBEDTLS_ERR_PEM_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "PEM - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_PEM_INVALID_ENC_IV) )
            mbedtls_snprintf( buf, buflen, "PEM - RSA IV is not in hex-format" );
        if( use_ret == -(MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG) )
            mbedtls_snprintf( buf, buflen, "PEM - Unsupported key encryption algorithm" );
        if( use_ret == -(MBEDTLS_ERR_PEM_PASSWORD_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "PEM - Private key password can't be empty" );
        if( use_ret == -(MBEDTLS_ERR_PEM_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PEM - Given private key password does not allow for correct decryption" );
        if( use_ret == -(MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PEM - Unavailable feature, e.g. hashing/encryption combination" );
        if( use_ret == -(MBEDTLS_ERR_PEM_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PEM - Bad input parameters to function" );
#endif /* MBEDTLS_PEM_PARSE_C || MBEDTLS_PEM_WRITE_C */

#if defined(MBEDTLS_PK_C)
        if( use_ret == -(MBEDTLS_ERR_PK_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "PK - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_PK_TYPE_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - Type mismatch, eg attempt to encrypt with an ECDSA key" );
        if( use_ret == -(MBEDTLS_ERR_PK_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PK - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PK_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "PK - Read/write of file failed" );
        if( use_ret == -(MBEDTLS_ERR_PK_KEY_INVALID_VERSION) )
            mbedtls_snprintf( buf, buflen, "PK - Unsupported key version" );
        if( use_ret == -(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PK - Invalid key tag or value" );
        if( use_ret == -(MBEDTLS_ERR_PK_UNKNOWN_PK_ALG) )
            mbedtls_snprintf( buf, buflen, "PK - Key algorithm is unsupported (only RSA and EC are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_PASSWORD_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "PK - Private key password can't be empty" );
        if( use_ret == -(MBEDTLS_ERR_PK_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - Given private key password does not allow for correct decryption" );
        if( use_ret == -(MBEDTLS_ERR_PK_INVALID_PUBKEY) )
            mbedtls_snprintf( buf, buflen, "PK - The pubkey tag or value is invalid (only RSA and EC are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_INVALID_ALG) )
            mbedtls_snprintf( buf, buflen, "PK - The algorithm tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE) )
            mbedtls_snprintf( buf, buflen, "PK - Elliptic curve is unsupported (only NIST curves are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PK - Unavailable feature, e.g. RSA disabled for RSA key" );
        if( use_ret == -(MBEDTLS_ERR_PK_SIG_LEN_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - The buffer contains a valid signature followed by more data" );
        if( use_ret == -(MBEDTLS_ERR_PK_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "PK - PK hardware accelerator failed" );
#endif /* MBEDTLS_PK_C */

#if defined(MBEDTLS_PKCS12_C)
        if( use_ret == -(MBEDTLS_ERR_PKCS12_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Feature not available, e.g. unsupported encryption scheme" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_PBE_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - PBE ASN.1 data not as expected" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Given private key password does not allow for correct decryption" );
#endif /* MBEDTLS_PKCS12_C */

#if defined(MBEDTLS_PKCS5_C)
        if( use_ret == -(MBEDTLS_ERR_PKCS5_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Unexpected ASN.1 data" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Requested encryption or digest alg not available" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Given private key password does not allow for correct decryption" );
#endif /* MBEDTLS_PKCS5_C */

#if defined(MBEDTLS_RSA_C)
        if( use_ret == -(MBEDTLS_ERR_RSA_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "RSA - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_RSA_INVALID_PADDING) )
            mbedtls_snprintf( buf, buflen, "RSA - Input data contains invalid padding and is rejected" );
        if( use_ret == -(MBEDTLS_ERR_RSA_KEY_GEN_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - Something failed during generation of a key" );
        if( use_ret == -(MBEDTLS_ERR_RSA_KEY_CHECK_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - Key failed to pass the validity check of the library" );
        if( use_ret == -(MBEDTLS_ERR_RSA_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The public key operation failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_PRIVATE_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The private key operation failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The PKCS#1 verification failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE) )
            mbedtls_snprintf( buf, buflen, "RSA - The output buffer for decryption is not large enough" );
        if( use_ret == -(MBEDTLS_ERR_RSA_RNG_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The random generator failed to generate non-zeros" );
        if( use_ret == -(MBEDTLS_ERR_RSA_UNSUPPORTED_OPERATION) )
            mbedtls_snprintf( buf, buflen, "RSA - The implementation does not offer the requested operation, for example, because of security violations or lack of functionality" );
        if( use_ret == -(MBEDTLS_ERR_RSA_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - RSA hardware accelerator failed" );
#endif /* MBEDTLS_RSA_C */
        // END generated code

        if( strlen( buf ) == 0 )
            mbedtls_snprintf( buf, buflen, "UNKNOWN ERROR CODE (%04X)", use_ret );
    }

    use_ret = ret & ~0xFF80;

    if( use_ret == 0 )
        return;

    // If high level code is present, make a concatenation between both
    // error strings.
    //
    len = strlen( buf );

    if( len > 0 )
    {
        if( buflen - len < 5 )
            return;

        mbedtls_snprintf( buf + len, buflen - len, " : " );

        buf += len + 3;
        buflen -= len + 3;
    }

    // Low level error codes
    //
    // BEGIN generated code
#if defined(MBEDTLS_AES_C)
    if( use_ret == -(MBEDTLS_ERR_AES_INVALID_KEY_LENGTH) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid key length" );
    if( use_ret == -(MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid data input length" );
    if( use_ret == -(MBEDTLS_ERR_AES_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid input data" );
    if( use_ret == -(MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "AES - Feature not available. For example, an unsupported AES key size" );
    if( use_ret == -(MBEDTLS_ERR_AES_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "AES - AES hardware accelerator failed" );
#endif /* MBEDTLS_AES_C */

#if defined(MBEDTLS_ARC4_C)
    if( use_ret == -(MBEDTLS_ERR_ARC4_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "ARC4 - ARC4 hardware accelerator failed" );
#endif /* MBEDTLS_ARC4_C */

#if defined(MBEDTLS_ARIA_C)
    if( use_ret == -(MBEDTLS_ERR_ARIA_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "ARIA - Bad input data" );
    if( use_ret == -(MBEDTLS_ERR_ARIA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "ARIA - Invalid data input length" );
    if( use_ret == -(MBEDTLS_ERR_ARIA_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "ARIA - Feature not available. For example, an unsupported ARIA key size" );
    if( use_ret == -(MBEDTLS_ERR_ARIA_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "ARIA - ARIA hardware accelerator failed" );
#endif /* MBEDTLS_ARIA_C */

#if defined(MBEDTLS_ASN1_PARSE_C)
    if( use_ret == -(MBEDTLS_ERR_ASN1_OUT_OF_DATA) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Out of data when parsing an ASN1 data structure" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) )
        mbedtls_snprintf( buf, buflen, "ASN1 - ASN1 tag was of an unexpected value" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_INVALID_LENGTH) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Error when trying to determine the length or invalid length" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_LENGTH_MISMATCH) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Actual length differs from expected length" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_INVALID_DATA) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Data is invalid" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_ALLOC_FAILED) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Memory allocation failed" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_BUF_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Buffer too small when writing ASN.1 data structure" );
#endif /* MBEDTLS_ASN1_PARSE_C */

#if defined(MBEDTLS_BASE64_C)
    if( use_ret == -(MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "BASE64 - Output buffer too small" );
    if( use_ret == -(MBEDTLS_ERR_BASE64_INVALID_CHARACTER) )
        mbedtls_snprintf( buf, buflen, "BASE64 - Invalid character in input" );
#endif /* MBEDTLS_BASE64_C */

#if defined(MBEDTLS_BIGNUM_C)
    if( use_ret == -(MBEDTLS_ERR_MPI_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - An error occurred while reading from or writing to a file" );
    if( use_ret == -(MBEDTLS_ERR_MPI_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_MPI_INVALID_CHARACTER) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - There is an invalid character in the digit string" );
    if( use_ret == -(MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The buffer is too small to write to" );
    if( use_ret == -(MBEDTLS_ERR_MPI_NEGATIVE_VALUE) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input arguments are negative or result in illegal output" );
    if( use_ret == -(MBEDTLS_ERR_MPI_DIVISION_BY_ZERO) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input argument for division is zero, which is not allowed" );
    if( use_ret == -(MBEDTLS_ERR_MPI_NOT_ACCEPTABLE) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input arguments are not acceptable" );
    if( use_ret == -(MBEDTLS_ERR_MPI_ALLOC_FAILED) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - Memory allocation failed" );
#endif /* MBEDTLS_BIGNUM_C */

#if defined(MBEDTLS_BLOWFISH_C)
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Bad input data" );
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Invalid data input length" );
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Blowfish hardware accelerator failed" );
#endif /* MBEDTLS_BLOWFISH_C */

#if defined(MBEDTLS_CAMELLIA_C)
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Bad input data" );
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Invalid data input length" );
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Camellia hardware accelerator failed" );
#endif /* MBEDTLS_CAMELLIA_C */

#if defined(MBEDTLS_CCM_C)
    if( use_ret == -(MBEDTLS_ERR_CCM_BAD_INPUT) )
        mbedtls_snprintf( buf, buflen, "CCM - Bad input parameters to the function" );
    if( use_ret == -(MBEDTLS_ERR_CCM_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "CCM - Authenticated decryption failed" );
    if( use_ret == -(MBEDTLS_ERR_CCM_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "CCM - CCM hardware accelerator failed" );
#endif /* MBEDTLS_CCM_C */

#if defined(MBEDTLS_CHACHA20_C)
    if( use_ret == -(MBEDTLS_ERR_CHACHA20_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "CHACHA20 - Invalid input parameter(s)" );
    if( use_ret == -(MBEDTLS_ERR_CHACHA20_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "CHACHA20 - Feature not available. For example, s part of the API is not implemented" );
    if( use_ret == -(MBEDTLS_ERR_CHACHA20_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "CHACHA20 - Chacha20 hardware accelerator failed" );
#endif /* MBEDTLS_CHACHA20_C */

#if defined(MBEDTLS_CHACHAPOLY_C)
    if( use_ret == -(MBEDTLS_ERR_CHACHAPOLY_BAD_STATE) )
        mbedtls_snprintf( buf, buflen, "CHACHAPOLY - The requested operation is not permitted in the current state" );
    if( use_ret == -(MBEDTLS_ERR_CHACHAPOLY_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "CHACHAPOLY - Authenticated decryption failed: data was not authentic" );
#endif /* MBEDTLS_CHACHAPOLY_C */

#if defined(MBEDTLS_CMAC_C)
    if( use_ret == -(MBEDTLS_ERR_CMAC_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "CMAC - CMAC hardware accelerator failed" );
#endif /* MBEDTLS_CMAC_C */

#if defined(MBEDTLS_CTR_DRBG_C)
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - The entropy source failed" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_REQUEST_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - The requested random buffer length is too big" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - The input (entropy + additional data) is too large" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - Read or write error in file" );
#endif /* MBEDTLS_CTR_DRBG_C */

#if defined(MBEDTLS_DES_C)
    if( use_ret == -(MBEDTLS_ERR_DES_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "DES - The data input has an invalid length" );
    if( use_ret == -(MBEDTLS_ERR_DES_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "DES - DES hardware accelerator failed" );
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_ENTROPY_C)
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - Critical entropy source failure" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_MAX_SOURCES) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No more sources can be added" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_NO_SOURCES_DEFINED) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No sources have been added to poll" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_NO_STRONG_SOURCE) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No strong sources have been added to poll" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - Read/write error in file" );
#endif /* MBEDTLS_ENTROPY_C */

#if defined(MBEDTLS_ERROR_C)
    if( use_ret == -(MBEDTLS_ERR_ERROR_GENERIC_ERROR) )
        mbedtls_snprintf( buf, buflen, "ERROR - Generic error" );
    if( use_ret == -(MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED) )
        mbedtls_snprintf( buf, buflen, "ERROR - This is a bug in the library" );
#endif /* MBEDTLS_ERROR_C */

#if defined(MBEDTLS_GCM_C)
    if( use_ret == -(MBEDTLS_ERR_GCM_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "GCM - Authenticated decryption failed" );
    if( use_ret == -(MBEDTLS_ERR_GCM_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "GCM - GCM hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_GCM_BAD_INPUT) )
        mbedtls_snprintf( buf, buflen, "GCM - Bad input parameters to function" );
#endif /* MBEDTLS_GCM_C */

#if defined(MBEDTLS_HKDF_C)
    if( use_ret == -(MBEDTLS_ERR_HKDF_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "HKDF - Bad input parameters to function" );
#endif /* MBEDTLS_HKDF_C */

#if defined(MBEDTLS_HMAC_DRBG_C)
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_REQUEST_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Too many random requested in single call" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Input too large (Entropy + additional)" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Read/write error in file" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - The entropy source failed" );
#endif /* MBEDTLS_HMAC_DRBG_C */

#if defined(MBEDTLS_MD2_C)
    if( use_ret == -(MBEDTLS_ERR_MD2_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "MD2 - MD2 hardware accelerator failed" );
#endif /* MBEDTLS_MD2_C */

#if defined(MBEDTLS_MD4_C)
    if( use_ret == -(MBEDTLS_ERR_MD4_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "MD4 - MD4 hardware accelerator failed" );
#endif /* MBEDTLS_MD4_C */

#if defined(MBEDTLS_MD5_C)
    if( use_ret == -(MBEDTLS_ERR_MD5_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "MD5 - MD5 hardware accelerator failed" );
#endif /* MBEDTLS_MD5_C */

#if defined(MBEDTLS_OID_C)
    if( use_ret == -(MBEDTLS_ERR_OID_NOT_FOUND) )
        mbedtls_snprintf( buf, buflen, "OID - OID is not found" );
    if( use_ret == -(MBEDTLS_ERR_OID_BUF_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "OID - output buffer is too small" );
#endif /* MBEDTLS_OID_C */

#if defined(MBEDTLS_PADLOCK_C)
    if( use_ret == -(MBEDTLS_ERR_PADLOCK_DATA_MISALIGNED) )
        mbedtls_snprintf( buf, buflen, "PADLOCK - Input data should be aligned" );
#endif /* MBEDTLS_PADLOCK_C */

#if defined(MBEDTLS_PLATFORM_C)
    if( use_ret == -(MBEDTLS_ERR_PLATFORM_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "PLATFORM - Hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED) )
        mbedtls_snprintf( buf, buflen, "PLATFORM - The requested feature is not supported by the platform" );
#endif /* MBEDTLS_PLATFORM_C */

#if defined(MBEDTLS_POLY1305_C)
    if( use_ret == -(MBEDTLS_ERR_POLY1305_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "POLY1305 - Invalid input parameter(s)" );
    if( use_ret == -(MBEDTLS_ERR_POLY1305_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "POLY1305 - Feature not available. For example, s part of the API is not implemented" );
    if( use_ret == -(MBEDTLS_ERR_POLY1305_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "POLY1305 - Poly1305 hardware accelerator failed" );
#endif /* MBEDTLS_POLY1305_C */

#if defined(MBEDTLS_RIPEMD160_C)
    if( use_ret == -(MBEDTLS_ERR_RIPEMD160_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "RIPEMD160 - RIPEMD160 hardware accelerator failed" );
#endif /* MBEDTLS_RIPEMD160_C */

#if defined(MBEDTLS_SHA1_C)
    if( use_ret == -(MBEDTLS_ERR_SHA1_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "SHA1 - SHA-1 hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_SHA1_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "SHA1 - SHA-1 input data was malformed" );
#endif /* MBEDTLS_SHA1_C */

#if defined(MBEDTLS_SHA256_C)
    if( use_ret == -(MBEDTLS_ERR_SHA256_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "SHA256 - SHA-256 hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_SHA256_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "SHA256 - SHA-256 input data was malformed" );
#endif /* MBEDTLS_SHA256_C */

#if defined(MBEDTLS_SHA512_C)
    if( use_ret == -(MBEDTLS_ERR_SHA512_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "SHA512 - SHA-512 hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_SHA512_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "SHA512 - SHA-512 input data was malformed" );
#endif /* MBEDTLS_SHA512_C */

#if defined(MBEDTLS_THREADING_C)
    if( use_ret == -(MBEDTLS_ERR_THREADING_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "THREADING - The selected feature is not available" );
    if( use_ret == -(MBEDTLS_ERR_THREADING_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "THREADING - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_THREADING_MUTEX_ERROR) )
        mbedtls_snprintf( buf, buflen, "THREADING - Locking / unlocking / free failed with error code" );
#endif /* MBEDTLS_THREADING_C */

#if defined(MBEDTLS_XTEA_C)
    if( use_ret == -(MBEDTLS_ERR_XTEA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "XTEA - The data input has an invalid length" );
    if( use_ret == -(MBEDTLS_ERR_XTEA_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "XTEA - XTEA hardware accelerator failed" );
#endif /* MBEDTLS_XTEA_C */
    // END generated code

    if( strlen( buf ) != 0 )
        return;

    mbedtls_snprintf( buf, buflen, "UNKNOWN ERROR CODE (%04X)", use_ret );
}